

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O1

int32_t __thiscall
xla::GraphCycles::ContractEdge(GraphCycles *this,int32_t a,int32_t b,bool *success)

{
  pointer pNVar1;
  Rep *pRVar2;
  iterator __position;
  pointer pNVar3;
  int *piVar4;
  int *piVar5;
  bool bVar6;
  long lVar7;
  int __tmp;
  int32_t y;
  __hashtable *__this;
  __hashtable *__this_1;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *puVar8;
  int *piVar9;
  size_type sVar10;
  int *piVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  OrderedNodeSet in;
  OrderedNodeSet out;
  int32_t local_dc;
  bool *local_d8;
  int *local_d0;
  int *local_c8;
  pointer local_c0;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  int *local_80;
  int *local_78;
  pointer local_70;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_dc = b;
  bVar6 = OrderedSet<int>::Contains
                    (&(this->rep_->node_io_).
                      super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                      ._M_impl.super__Vector_impl_data._M_start[a].out,b);
  if (!bVar6) {
    __assert_fail("HasEdge(a, b) && \"No edge exists from a to b\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/xla/graphcycles.cc"
                  ,0x1bc,"int32_t xla::GraphCycles::ContractEdge(int32_t, int32_t, bool &)");
  }
  RemoveEdge(this,a,local_dc);
  bVar6 = IsReachableNonConst(this,a,local_dc);
  if (bVar6) {
    InsertEdge(this,a,local_dc);
    *success = false;
    y = -1;
  }
  else {
    lVar7 = (long)local_dc;
    pNVar1 = (this->rep_->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    y = a;
    if ((ulong)(((long)*(pointer *)
                        ((long)&pNVar1[a].out.value_sequence_.
                                super__Vector_base<int,_std::allocator<int>_> + 8) -
                 *(long *)&pNVar1[a].out.value_sequence_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2) +
               ((long)*(pointer *)
                       ((long)&pNVar1[a].in.value_sequence_.
                               super__Vector_base<int,_std::allocator<int>_> + 8) -
                *(long *)&pNVar1[a].in.value_sequence_.super__Vector_base<int,_std::allocator<int>_>
               >> 2)) <
        (ulong)(((long)*(pointer *)
                        ((long)&pNVar1[lVar7].out.value_sequence_.
                                super__Vector_base<int,_std::allocator<int>_> + 8) -
                 *(long *)&pNVar1[lVar7].out.value_sequence_.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl >> 2) +
               ((long)*(pointer *)
                       ((long)&pNVar1[lVar7].in.value_sequence_.
                               super__Vector_base<int,_std::allocator<int>_> + 8) -
                *(long *)&pNVar1[lVar7].in.value_sequence_.
                          super__Vector_base<int,_std::allocator<int>_> >> 2))) {
      y = local_dc;
      local_dc = a;
    }
    lVar7 = (long)local_dc;
    pNVar3 = pNVar1 + lVar7;
    puVar8 = &(pNVar3->out).value_to_index_;
    local_80 = *(int **)&(pNVar3->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>
                         ._M_impl;
    local_78 = *(pointer *)
                ((long)&(pNVar3->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>
                + 8);
    local_70 = *(pointer *)
                ((long)&(pNVar3->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>
                + 0x10);
    *(pointer *)
     ((long)&(pNVar3->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 0x10) =
         (pointer)0x0;
    *(undefined8 *)
     &(pNVar3->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl = 0;
    *(pointer *)
     ((long)&(pNVar3->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8) =
         (pointer)0x0;
    local_d8 = success;
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_68,puVar8,puVar8);
    local_d0 = *(int **)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>;
    local_c8 = *(pointer *)
                ((long)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> +
                8);
    local_c0 = *(pointer *)
                ((long)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> +
                0x10);
    *(pointer *)
     ((long)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 0x10) =
         (pointer)0x0;
    *(undefined8 *)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> = 0;
    *(pointer *)
     ((long)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8) =
         (pointer)0x0;
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_b8,&pNVar1[lVar7].in.value_to_index_);
    piVar5 = local_78;
    for (piVar11 = local_80; piVar4 = local_c8, piVar9 = local_d0, piVar11 != piVar5;
        piVar11 = piVar11 + 1) {
      OrderedSet<int>::Erase
                (&(this->rep_->node_io_).
                  super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar11].in,local_dc);
    }
    for (; piVar9 != piVar4; piVar9 = piVar9 + 1) {
      OrderedSet<int>::Erase
                (&(this->rep_->node_io_).
                  super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar9].out,local_dc);
    }
    pRVar2 = this->rep_;
    __position._M_current =
         (pRVar2->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pRVar2->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&pRVar2->free_nodes_,__position,&local_dc);
    }
    else {
      *__position._M_current = local_dc;
      (pRVar2->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    pNVar1 = (this->rep_->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar10 = ((long)local_78 - (long)local_80 >> 2) +
             ((long)*(pointer *)
                     ((long)&pNVar1[y].out.value_sequence_.
                             super__Vector_base<int,_std::allocator<int>_> + 8) -
              *(long *)&pNVar1[y].out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl >> 2);
    auVar13._8_4_ = (int)(sVar10 >> 0x20);
    auVar13._0_8_ = sVar10;
    auVar13._12_4_ = 0x45300000;
    dVar12 = ceil(((auVar13._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)) /
                  (double)((_Prime_rehash_policy *)
                          ((long)&pNVar1[y].out.value_to_index_._M_h + 0x20))->_M_max_load_factor);
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::rehash(&pNVar1[y].out.value_to_index_._M_h,
             (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12);
    std::vector<int,_std::allocator<int>_>::reserve(&pNVar1[y].out.value_sequence_,sVar10);
    piVar5 = local_78;
    for (piVar11 = local_80; piVar11 != piVar5; piVar11 = piVar11 + 1) {
      InsertEdge(this,y,*piVar11);
    }
    pNVar3 = (this->rep_->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar1 = pNVar3 + y;
    sVar10 = ((long)local_c8 - (long)local_d0 >> 2) +
             ((long)*(pointer *)
                     ((long)&(pNVar1->in).value_sequence_.
                             super__Vector_base<int,_std::allocator<int>_> + 8) -
              *(long *)&(pNVar1->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>
             >> 2);
    auVar14._8_4_ = (int)(sVar10 >> 0x20);
    auVar14._0_8_ = sVar10;
    auVar14._12_4_ = 0x45300000;
    dVar12 = ceil(((auVar14._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)) /
                  (double)((_Prime_rehash_policy *)((long)&(pNVar1->in).value_to_index_._M_h + 0x20)
                          )->_M_max_load_factor);
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::rehash(&(pNVar1->in).value_to_index_._M_h,
             (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)(pNVar3 + y),sVar10);
    piVar5 = local_c8;
    for (piVar11 = local_d0; piVar11 != piVar5; piVar11 = piVar11 + 1) {
      InsertEdge(this,*piVar11,y);
    }
    *local_d8 = true;
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_b8);
    if (local_d0 != (int *)0x0) {
      operator_delete(local_d0,(long)local_c0 - (long)local_d0);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    if (local_80 != (int *)0x0) {
      operator_delete(local_80,(long)local_70 - (long)local_80);
    }
  }
  return y;
}

Assistant:

int32_t GraphCycles::ContractEdge(int32_t a, int32_t b, bool &success) {
  assert(HasEdge(a, b) && "No edge exists from a to b");
  RemoveEdge(a, b);

  if (IsReachableNonConst(a, b)) {
    // Restore the graph to its original state.
    InsertEdge(a, b);
    success = false;
    return -1;
  }

  if (rep_->node_io_[b].in.Size() + rep_->node_io_[b].out.Size() >
      rep_->node_io_[a].in.Size() + rep_->node_io_[a].out.Size()) {
    // Swap "a" and "b" to minimize copying.
    std::swap(a, b);
  }

  NodeIO* nb_io = &rep_->node_io_[b];
  OrderedNodeSet out = std::move(nb_io->out);
  OrderedNodeSet in = std::move(nb_io->in);
  for (int32_t y : out.GetSequence()) {
    rep_->node_io_[y].in.Erase(b);
  }
  for (int32_t y : in.GetSequence()) {
    rep_->node_io_[y].out.Erase(b);
  }
  rep_->free_nodes_.push_back(b);

  rep_->node_io_[a].out.Reserve(rep_->node_io_[a].out.Size() + out.Size());
  for (int32_t y : out.GetSequence()) {
    InsertEdge(a, y);
  }

  rep_->node_io_[a].in.Reserve(rep_->node_io_[a].in.Size() + in.Size());
  for (int32_t y : in.GetSequence()) {
    InsertEdge(y, a);
  }

  // Note, if the swap happened it might be what originally was called "b".
  success = true;
  return a;
}